

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O0

void append_to_file(ang_file *fff)

{
  wchar_t wVar1;
  bool bVar2;
  wchar_t local_68;
  wchar_t local_64;
  wchar_t local_60;
  wchar_t local_5c;
  wchar_t c_1;
  wchar_t n_1;
  wchar_t a_1;
  wchar_t x_1;
  char *p_1;
  wchar_t c;
  wchar_t n;
  wchar_t a;
  wchar_t x;
  char *p;
  char *buf;
  int local_20;
  wchar_t y;
  wchar_t hgt;
  wchar_t wid;
  wchar_t cached_npage;
  wchar_t cached_ifirst;
  ang_file *fff_local;
  
  _cached_npage = fff;
  if (s_for_file == (equippable_summary *)0x0) {
    wVar1 = initialize_summary(player,&the_summary);
    if (wVar1 != L'\0') {
      return;
    }
    s_for_file = the_summary;
  }
  wid = s_for_file->ifirst;
  hgt = s_for_file->npage;
  if ((s_for_file->indinc < L'\x01') && (s_for_file->nfilt != L'\0')) {
    local_64 = s_for_file->nfilt + L'\xffffffff';
  }
  else {
    local_64 = L'\0';
  }
  s_for_file->ifirst = local_64;
  if (s_for_file->nfilt < s_for_file->maxpage) {
    local_68 = s_for_file->nfilt;
  }
  else {
    local_68 = s_for_file->maxpage;
  }
  s_for_file->npage = local_68;
  Term_get_size(&y,&local_20);
  wVar1 = text_wcsz();
  p = (char *)mem_alloc((long)(wVar1 * y + 1));
  display_page(s_for_file,player,false);
  for (buf._4_4_ = s_for_file->irow_combined_equip - s_for_file->nproplab;
      buf._4_4_ < s_for_file->irow_combined_equip + L'\x01' + s_for_file->npage;
      buf._4_4_ = buf._4_4_ + L'\x01') {
    _a = p;
    for (n = L'\0'; n < y; n = n + L'\x01') {
      Term_what(n,buf._4_4_,&c,(wchar_t *)&p_1);
      p_1._4_4_ = text_wctomb(_a,(wchar_t)p_1);
      if (p_1._4_4_ < L'\x01') {
        *_a = ' ';
        _a = _a + 1;
      }
      else {
        _a = _a + p_1._4_4_;
      }
    }
    while( true ) {
      bVar2 = false;
      if (p < _a) {
        bVar2 = _a[-1] == ' ';
      }
      if (!bVar2) break;
      _a = _a + -1;
    }
    *_a = '\0';
    file_putf(_cached_npage,"%s\n",p);
  }
  do {
    s_for_file->ifirst = s_for_file->npage * s_for_file->indinc + s_for_file->ifirst;
    if (s_for_file->indinc < L'\x01') {
      if (s_for_file->ifirst < L'\0') goto LAB_00245596;
      if (s_for_file->ifirst - s_for_file->npage < -1) {
        s_for_file->npage = s_for_file->ifirst + L'\x01';
      }
    }
    else {
      if (s_for_file->nfilt <= s_for_file->ifirst) {
LAB_00245596:
        mem_free(p);
        s_for_file->ifirst = wid;
        s_for_file->npage = hgt;
        s_for_file = (equippable_summary *)0x0;
        return;
      }
      if (s_for_file->nfilt < s_for_file->ifirst + s_for_file->npage) {
        s_for_file->npage = s_for_file->nfilt - s_for_file->ifirst;
      }
    }
    display_page(s_for_file,player,false);
    buf._4_4_ = s_for_file->irow_combined_equip;
    while (buf._4_4_ = buf._4_4_ + L'\x01',
          buf._4_4_ < s_for_file->irow_combined_equip + L'\x01' + s_for_file->npage) {
      _a_1 = p;
      for (n_1 = L'\0'; n_1 < y; n_1 = n_1 + L'\x01') {
        Term_what(n_1,buf._4_4_,&c_1,&local_60);
        local_5c = text_wctomb(_a_1,local_60);
        if (local_5c < L'\x01') {
          *_a_1 = ' ';
          _a_1 = _a_1 + 1;
        }
        else {
          _a_1 = _a_1 + local_5c;
        }
      }
      while( true ) {
        bVar2 = false;
        if (p < _a_1) {
          bVar2 = _a_1[-1] == ' ';
        }
        if (!bVar2) break;
        _a_1 = _a_1 + -1;
      }
      *_a_1 = '\0';
      file_putf(_cached_npage,"%s\n",p);
    }
  } while( true );
}

Assistant:

static void append_to_file(ang_file *fff)
{
	int cached_ifirst, cached_npage;
	int wid, hgt, y;
	char *buf;

	if (!s_for_file) {
		if (initialize_summary(player, &the_summary)) {
			return;
		}
		s_for_file = the_summary;
	}

	cached_ifirst = s_for_file->ifirst;
	cached_npage = s_for_file->npage;
	s_for_file->ifirst =
		(s_for_file->indinc > 0 || s_for_file->nfilt == 0) ?
		0 : s_for_file->nfilt - 1;
	s_for_file->npage =
		(s_for_file->maxpage <= s_for_file->nfilt) ?
		s_for_file->maxpage : s_for_file->nfilt;

	Term_get_size(&wid, &hgt);
	buf = mem_alloc(text_wcsz() * wid + 1);

	(void) display_page(s_for_file, player, false);

	/* Dump part of the screen. */
	for (y = s_for_file->irow_combined_equip - s_for_file->nproplab;
		y < s_for_file->irow_combined_equip + 1 + s_for_file->npage;
		++y) {
		char *p = buf;
		int x, a, n;
		wchar_t c;

		/* Dump a row. */
		for (x = 0; x < wid; ++x) {
			(void) Term_what(x, y, &a, &c);
			n = text_wctomb(p, c);
			if (n > 0) {
				p += n;
			} else {
				*p++ = ' ';
			}
		}
		/* Back up over spaces */
		while ((p > buf) && (p[-1] == ' ')) {
			--p;
		}
		/* Terminate */
		*p = '\0';

		file_putf(fff, "%s\n", buf);
	}

	while (1) {
		s_for_file->ifirst += s_for_file->npage * s_for_file->indinc;
		if (s_for_file->indinc > 0) {
			if (s_for_file->ifirst >= s_for_file->nfilt) {
				break;
			}
			if (s_for_file->ifirst + s_for_file->npage >
				s_for_file->nfilt) {
				s_for_file->npage = s_for_file->nfilt -
					s_for_file->ifirst;
			}
		} else {
			if (s_for_file->ifirst < 0) {
				break;
			}
			if (s_for_file->ifirst - s_for_file->npage < -1) {
				s_for_file->npage = s_for_file->ifirst + 1;
			}
		}

		(void) display_page(s_for_file, player, false);

		/*
		 * Dump part of the screen.  Exclude the header that appeared
		 * on the first page.
		 */
		for (y = s_for_file->irow_combined_equip + 1;
			y < s_for_file->irow_combined_equip + 1 +
			s_for_file->npage; ++y) {
			char *p = buf;
			int x, a, n;
			wchar_t c;

			/* Dump a row. */
			for (x = 0; x < wid; ++x) {
				(void) Term_what(x, y, &a, &c);
				n = text_wctomb(p, c);
				if (n > 0) {
					p += n;
				} else {
					*p++ = ' ';
				}
			}
			/* Back up over spaces */
			while ((p > buf) && (p[-1] == ' ')) {
				--p;
			}
			/* Terminate */
			*p = '\0';

			file_putf(fff, "%s\n", buf);
		}
	}

	mem_free(buf);

	s_for_file->ifirst = cached_ifirst;
	s_for_file->npage = cached_npage;
	s_for_file = NULL;
}